

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

bcf_hdr_t * bcf_hdr_init(char *mode)

{
  bcf_hdr_t *hdr;
  kh_vdict_t *pkVar1;
  char *pcVar2;
  bcf_hdr_t *h;
  int i;
  char *mode_local;
  
  hdr = (bcf_hdr_t *)calloc(1,0x98);
  for (h._4_4_ = 0; h._4_4_ < 3; h._4_4_ = h._4_4_ + 1) {
    pkVar1 = kh_init_vdict();
    hdr->dict[h._4_4_] = pkVar1;
  }
  pcVar2 = strchr(mode,0x77);
  if (pcVar2 != (char *)0x0) {
    bcf_hdr_append(hdr,"##fileformat=VCFv4.2");
    bcf_hdr_append(hdr,"##FILTER=<ID=PASS,Description=\"All filters passed\">");
  }
  return hdr;
}

Assistant:

bcf_hdr_t *bcf_hdr_init(const char *mode)
{
    int i;
    bcf_hdr_t *h;
    h = (bcf_hdr_t*)calloc(1, sizeof(bcf_hdr_t));
    for (i = 0; i < 3; ++i)
        h->dict[i] = kh_init(vdict);
    if ( strchr(mode,'w') )
    {
        bcf_hdr_append(h, "##fileformat=VCFv4.2");
        // The filter PASS must appear first in the dictionary
        bcf_hdr_append(h, "##FILTER=<ID=PASS,Description=\"All filters passed\">");
    }
    return h;
}